

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void cl_reset_reader(Curl_easy *data)

{
  Curl_creader *local_18;
  Curl_creader *reader;
  Curl_easy *data_local;
  
  local_18 = (data->req).reader_stack;
  while (local_18 != (Curl_creader *)0x0) {
    (data->req).reader_stack = local_18->next;
    (*local_18->crt->do_close)(data,local_18);
    (*Curl_cfree)(local_18);
    local_18 = (data->req).reader_stack;
  }
  return;
}

Assistant:

static void cl_reset_reader(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  while(reader) {
    data->req.reader_stack = reader->next;
    reader->crt->do_close(data, reader);
    free(reader);
    reader = data->req.reader_stack;
  }
}